

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Parser.h
# Opt level: O3

void __thiscall soul::StructuralParser::parseTopLevelDeclContent(StructuralParser *this)

{
  ModuleBase *pMVar1;
  char *pcVar2;
  _func_int **pp_Var3;
  SourceCodeText *pSVar4;
  bool bVar5;
  int iVar6;
  ProcessorBase *p;
  size_type sVar7;
  Namespace *parentNamespace;
  char *pcVar8;
  CompileMessage local_b8;
  undefined1 local_80 [16];
  undefined1 local_70 [16];
  undefined1 local_60 [16];
  Ptr local_50;
  undefined1 local_48 [16];
  
  parseSpecialisationParameters(this);
  pMVar1 = (this->module).object;
  if (pMVar1 == (ModuleBase *)0x0) {
    parentNamespace = (Namespace *)0x0;
    sVar7 = 0;
  }
  else {
    p = (ProcessorBase *)
        __dynamic_cast(pMVar1,&AST::ModuleBase::typeinfo,&AST::ProcessorBase::typeinfo,0);
    sVar7 = __dynamic_cast(pMVar1,&AST::ModuleBase::typeinfo,&AST::Graph::typeinfo,0);
    parentNamespace =
         (Namespace *)__dynamic_cast(pMVar1,&AST::ModuleBase::typeinfo,&AST::Namespace::typeinfo,0);
    if (p != (ProcessorBase *)0x0) {
      parseAnnotation(this,&p->annotation);
      Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
      ::expect<soul::TokenType>(&this->super_SOULTokeniser,(TokenType)0x259fad);
      do {
        bVar5 = parseEndpoint(this,p);
      } while (bVar5);
      goto LAB_001d2ca5;
    }
  }
  Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
  ::expect<soul::TokenType>(&this->super_SOULTokeniser,(TokenType)0x259fad);
LAB_001d2ca5:
  if (parentNamespace != (Namespace *)0x0) {
    parseImports(this,parentNamespace);
  }
  bVar5 = Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
          ::matchIf<soul::TokenType>(&this->super_SOULTokeniser,(TokenType)0x258ac2);
  if (!bVar5) {
    local_50.object = (SourceCodeText *)0x27bccb;
    if (parentNamespace == (Namespace *)0x0) {
      local_50.object = (SourceCodeText *)0x27bcfc;
    }
    do {
      if (sVar7 == 0) {
        bVar5 = Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
                ::matchIf<soul::TokenType>(&this->super_SOULTokeniser,(TokenType)0x27d252);
        if (bVar5) {
          parseStructDeclaration(this);
        }
        else {
          pcVar8 = (this->super_SOULTokeniser).currentType.text;
          if (pcVar8 != "graph") {
            if (pcVar8 == (char *)0x0) goto LAB_001d2dd2;
            iVar6 = strcmp(pcVar8,"graph");
            if (iVar6 != 0) goto LAB_001d2dae;
          }
          if (parentNamespace == (Namespace *)0x0) {
            CompileMessageHelpers::createMessage<>
                      (&local_b8,syntax,error,"A graph can only be defined inside a namespace");
            (*(this->super_SOULTokeniser)._vptr_Tokeniser[2])(this,&local_b8);
            RefCountedPtr<soul::SourceCodeText>::decIfNotNull(local_b8.location.sourceCode.object);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_b8.description._M_dataplus._M_p != &local_b8.description.field_2) {
              operator_delete(local_b8.description._M_dataplus._M_p,
                              local_b8.description.field_2._M_allocated_capacity + 1);
            }
          }
          pSVar4 = (this->super_SOULTokeniser).location.sourceCode.object;
          if (pSVar4 != (SourceCodeText *)0x0) {
            (pSVar4->super_RefCountedObject).refCount =
                 (pSVar4->super_RefCountedObject).refCount + 1;
          }
          pp_Var3 = (_func_int **)(this->super_SOULTokeniser).location.location.data;
          Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
          ::skip(&this->super_SOULTokeniser);
          if (pSVar4 != (SourceCodeText *)0x0) {
            (pSVar4->super_RefCountedObject).refCount =
                 (pSVar4->super_RefCountedObject).refCount + 1;
          }
          local_60._0_8_ = pSVar4;
          local_60._8_8_ = pp_Var3;
          if (parentNamespace == (Namespace *)0x0) {
            throwInternalCompilerError("object != nullptr","operator*",0x3b);
          }
          parseGraphDecl((StructuralParser *)&stack0xffffffffffffffc8,(CodeLocation *)this,
                         (Namespace *)local_60);
          RefCountedPtr<soul::SourceCodeText>::decIfNotNull((SourceCodeText *)local_60._0_8_);
          RefCountedPtr<soul::SourceCodeText>::decIfNotNull(pSVar4);
        }
      }
      else {
        local_b8.description._M_dataplus._M_p = (pointer)this;
        local_b8.description._M_string_length = sVar7;
        bVar5 = parseOptionallyBracedList<soul::TokenType,soul::StructuralParser::parseProcessorInstanceList(soul::AST::Graph&)::_lambda()_1_>
                          (this,(TokenType)0x27b6f5,true,(anon_class_16_2_fd512dd4 *)&local_b8);
        if ((!bVar5) &&
           (local_b8.description._M_dataplus._M_p = (pointer)this,
           local_b8.description._M_string_length = sVar7,
           bVar5 = parseOptionallyBracedList<soul::TokenType,soul::StructuralParser::parseConnectionList(soul::AST::Graph&)::_lambda()_1_>
                             (this,(TokenType)0x27c316,false,(anon_class_16_2_fd512dd4 *)&local_b8),
           !bVar5)) {
          pcVar8 = (this->super_SOULTokeniser).currentType.text;
LAB_001d2dae:
          if ((pcVar8 == "processor") ||
             ((pcVar8 != (char *)0x0 && (iVar6 = strcmp(pcVar8,"processor"), iVar6 == 0)))) {
            pSVar4 = (this->super_SOULTokeniser).location.sourceCode.object;
            if (pSVar4 != (SourceCodeText *)0x0) {
              (pSVar4->super_RefCountedObject).refCount =
                   (pSVar4->super_RefCountedObject).refCount + 1;
            }
            pcVar8 = (this->super_SOULTokeniser).location.location.data;
            Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
            ::skip(&this->super_SOULTokeniser);
            pcVar2 = (this->super_SOULTokeniser).currentType.text;
            if ((pcVar2 == ".") ||
               (((pcVar2 != (char *)0x0 && (*pcVar2 == '.')) && (pcVar2[1] == '\0')))) {
              parseProcessorLatencyDeclaration(this);
            }
            else {
              if (parentNamespace == (Namespace *)0x0) {
                CompileMessageHelpers::createMessage<>
                          (&local_b8,syntax,error,
                           "A processor can only be defined inside a namespace");
                (*(this->super_SOULTokeniser)._vptr_Tokeniser[2])(this,&local_b8);
                RefCountedPtr<soul::SourceCodeText>::decIfNotNull
                          (local_b8.location.sourceCode.object);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_b8.description._M_dataplus._M_p != &local_b8.description.field_2) {
                  operator_delete(local_b8.description._M_dataplus._M_p,
                                  local_b8.description.field_2._M_allocated_capacity + 1);
                }
              }
              if (pSVar4 != (SourceCodeText *)0x0) {
                (pSVar4->super_RefCountedObject).refCount =
                     (pSVar4->super_RefCountedObject).refCount + 1;
              }
              local_70._0_8_ = pSVar4;
              local_70._8_8_ = pcVar8;
              if (parentNamespace == (Namespace *)0x0) {
                throwInternalCompilerError("object != nullptr","operator*",0x3b);
              }
              parseProcessorDecl((StructuralParser *)(local_48 + 8),(CodeLocation *)this,
                                 (Namespace *)local_70);
              RefCountedPtr<soul::SourceCodeText>::decIfNotNull((SourceCodeText *)local_70._0_8_);
            }
            RefCountedPtr<soul::SourceCodeText>::decIfNotNull(pSVar4);
          }
          else {
LAB_001d2dd2:
            bVar5 = Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
                    ::matchIf<soul::TokenType>(&this->super_SOULTokeniser,(TokenType)0x27b71c);
            if (bVar5) {
              parseUsingDeclaration(this);
            }
            else {
              bVar5 = Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
                      ::matchIf<soul::TokenType>(&this->super_SOULTokeniser,(TokenType)0x27b6f5);
              if (bVar5) {
                bVar5 = true;
              }
              else {
                bVar5 = Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
                        ::matchIf<soul::TokenType>(&this->super_SOULTokeniser,(TokenType)0x27b6f9);
                if (!bVar5) {
                  bVar5 = Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
                          ::matchIf<soul::TokenType>(&this->super_SOULTokeniser,(TokenType)0x259d29)
                  ;
                  if (bVar5) {
                    parseEventFunction(this);
                  }
                  else {
                    pcVar8 = (this->super_SOULTokeniser).currentType.text;
                    if ((pcVar8 == "namespace") ||
                       ((pcVar8 != (char *)0x0 && (iVar6 = strcmp(pcVar8,"namespace"), iVar6 == 0)))
                       ) {
                      pSVar4 = (this->super_SOULTokeniser).location.sourceCode.object;
                      if (pSVar4 != (SourceCodeText *)0x0) {
                        (pSVar4->super_RefCountedObject).refCount =
                             (pSVar4->super_RefCountedObject).refCount + 1;
                      }
                      pcVar8 = (this->super_SOULTokeniser).location.location.data;
                      Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
                      ::skip(&this->super_SOULTokeniser);
                      if (pSVar4 != (SourceCodeText *)0x0) {
                        (pSVar4->super_RefCountedObject).refCount =
                             (pSVar4->super_RefCountedObject).refCount + 1;
                      }
                      local_80._0_8_ = pSVar4;
                      local_80._8_8_ = pcVar8;
                      if ((this->module).object == (ModuleBase *)0x0) {
                        throwInternalCompilerError("object != nullptr","operator*",0x3b);
                      }
                      parseNamespaceDecl((StructuralParser *)local_48,(CodeLocation *)this,
                                         (ModuleBase *)local_80);
                      RefCountedPtr<soul::SourceCodeText>::decIfNotNull
                                ((SourceCodeText *)local_80._0_8_);
                      RefCountedPtr<soul::SourceCodeText>::decIfNotNull(pSVar4);
                    }
                    else {
                      bVar5 = Tokeniser<soul::Keyword::Matcher,soul::StandardOperatorMatcher,soul::StandardIdentifierMatcher>
                              ::matchesAny<soul::TokenType,soul::TokenType>
                                        ((Tokeniser<soul::Keyword::Matcher,soul::StandardOperatorMatcher,soul::StandardIdentifierMatcher>
                                          *)this,(TokenType)0x27e4e0,(TokenType)0x27ee60);
                      if (bVar5) {
                        CompileMessageHelpers::createMessage<>
                                  (&local_b8,syntax,error,(char *)local_50.object);
                        (*(this->super_SOULTokeniser)._vptr_Tokeniser[2])(this,&local_b8);
                        RefCountedPtr<soul::SourceCodeText>::decIfNotNull
                                  (local_b8.location.sourceCode.object);
                        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)local_b8.description._M_dataplus._M_p !=
                            &local_b8.description.field_2) {
                          operator_delete(local_b8.description._M_dataplus._M_p,
                                          local_b8.description.field_2._M_allocated_capacity + 1);
                        }
                      }
                      pcVar8 = (this->super_SOULTokeniser).currentType.text;
                      if ((pcVar8 == "import") ||
                         ((pcVar8 != (char *)0x0 && (iVar6 = strcmp(pcVar8,"import"), iVar6 == 0))))
                      {
                        CompileMessageHelpers::createMessage<>
                                  (&local_b8,syntax,error,
                                   "Import statements can only be declared at the start of a namespace"
                                  );
                        (*(this->super_SOULTokeniser)._vptr_Tokeniser[2])(this,&local_b8);
                        RefCountedPtr<soul::SourceCodeText>::decIfNotNull
                                  (local_b8.location.sourceCode.object);
                        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)local_b8.description._M_dataplus._M_p !=
                            &local_b8.description.field_2) {
                          operator_delete(local_b8.description._M_dataplus._M_p,
                                          local_b8.description.field_2._M_allocated_capacity + 1);
                        }
                      }
                      parseFunctionOrStateVariable(this);
                    }
                  }
                  goto LAB_001d2fc4;
                }
                bVar5 = false;
              }
              parseTopLevelLetOrVar(this,bVar5);
            }
          }
        }
      }
LAB_001d2fc4:
      bVar5 = Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
              ::matchIf<soul::TokenType>(&this->super_SOULTokeniser,(TokenType)0x258ac2);
    } while (!bVar5);
  }
  giveErrorOnSemicolon(this);
  return;
}

Assistant:

void parseTopLevelDeclContent()
    {
        parseSpecialisationParameters();

        auto processor = cast<AST::ProcessorBase> (module);
        auto graph     = cast<AST::Graph> (module);
        auto ns        = cast<AST::Namespace> (module);

        if (processor != nullptr)
            parseAnnotation (processor->annotation);

        expect (Operator::openBrace);

        if (processor != nullptr)
        {
            while (parseEndpoint (*processor))
            {}
        }

        if (ns != nullptr)
            parseImports (*ns);

        while (! matchIf (Operator::closeBrace))
        {
            if (graph != nullptr)
            {
                if (parseProcessorInstanceList (*graph)) continue;
                if (parseConnectionList (*graph))        continue;
            }
            else
            {
                if (matchIf (Keyword::struct_))         { parseStructDeclaration();  continue; }

                if (matches (Keyword::graph))
                {
                    if (ns == nullptr)
                        throwError (Errors::graphMustBeInsideNamespace());

                    auto keywordLocation = location;
                    skip();

                    parseGraphDecl (keywordLocation, *ns);
                    continue;
                }
            }

            if (matches (Keyword::processor))
            {
                auto keywordLocation = location;
                skip();

                if (matches (Operator::dot))
                {
                    parseProcessorLatencyDeclaration();
                    continue;
                }

                if (ns == nullptr)
                    throwError (Errors::processorMustBeInsideNamespace());

                parseProcessorDecl (keywordLocation, *ns);
                continue;
            }

            if (matchIf (Keyword::using_))          { parseUsingDeclaration();             continue; }
            if (matchIf (Keyword::let))             { parseTopLevelLetOrVar (true);        continue; }
            if (matchIf (Keyword::var))             { parseTopLevelLetOrVar (false);       continue; }
            if (matchIf (Keyword::event))           { parseEventFunction();                continue; }

            if (matches (Keyword::namespace_))
            {
                auto keywordLocation = location;
                skip();
                parseNamespaceDecl (keywordLocation, *module);
                continue;
            }

            if (matchesAny (Keyword::input, Keyword::output))
                throwError (ns != nullptr ? Errors::namespaceCannotContainEndpoints()
                                          : Errors::endpointDeclsMustBeFirst());

            if (matches (Keyword::import))
                throwError (Errors::importsMustBeAtStart());

            parseFunctionOrStateVariable();
        }

        giveErrorOnSemicolon();
    }